

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O2

void __thiscall StringTest::Test1(StringTest *this)

{
  int iVar1;
  allocator<char> local_149;
  string t8;
  string t7;
  string t6;
  string t4;
  string t3;
  string t2;
  string t1;
  string t5;
  string local_48 [32];
  string t;
  
  t._M_dataplus._M_p = (pointer)&t.field_2;
  t._M_string_length = 0;
  t.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t1,"this is t1",(allocator<char> *)&t2);
  std::__cxx11::string::string((string *)&t2,(string *)&t1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t3,"this is t3 ",(allocator<char> *)&t4);
  std::__cxx11::string::string((string *)&t4,(string *)&t3);
  t5._M_dataplus._M_p = (pointer)&t5.field_2;
  t5.field_2._M_allocated_capacity = 0x2073692073696874;
  t5.field_2._8_4_ = 0x20203574;
  t5._M_string_length = 0xc;
  t5.field_2._M_local_buf[0xc] = '\0';
  t6._M_dataplus._M_p = (pointer)&t6.field_2;
  t6._M_string_length = 0;
  t7._M_dataplus._M_p = (pointer)&t7.field_2;
  t7._M_string_length = 0;
  t6.field_2._M_local_buf[0] = '\0';
  t7.field_2._M_local_buf[0] = '\0';
  t8._M_dataplus._M_p = (pointer)&t8.field_2;
  t8._M_string_length = 0;
  t8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&t6,'a');
  std::__cxx11::string::assign((char *)&t7,0x1080f6);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"this is t5    ",&local_149);
  std::__cxx11::string::assign((string *)&t8,(ulong)local_48,5);
  std::__cxx11::string::~string(local_48);
  if (t._M_string_length != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x81,"default contrutor made non-zero sized string");
  }
  if (t1._M_string_length == 10) {
    iVar1 = strcmp(t1._M_dataplus._M_p,"this is t1");
    if (iVar1 != 0) goto LAB_00104cbc;
  }
  else {
LAB_00104cbc:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x84,"t1 not correct");
  }
  if (t2._M_string_length == 10) {
    iVar1 = strcmp(t2._M_dataplus._M_p,"this is t1");
    if (iVar1 != 0) goto LAB_00104cfc;
  }
  else {
LAB_00104cfc:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x87,"t2 not correct");
  }
  if (t3._M_string_length == 0xb) {
    iVar1 = strcmp(t3._M_dataplus._M_p,"this is t3 ");
    if (iVar1 != 0) goto LAB_00104d3c;
  }
  else {
LAB_00104d3c:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x8a,"t3 not correct");
  }
  if (t4._M_string_length == 0xb) {
    iVar1 = strcmp(t4._M_dataplus._M_p,"this is t3 ");
    if (iVar1 != 0) goto LAB_00104d76;
  }
  else {
LAB_00104d76:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x8d,"t4 not correct");
  }
  if (t5._M_string_length == 0xc) {
    iVar1 = strcmp(t5._M_dataplus._M_p,"this is t5  ");
    if (iVar1 != 0) goto LAB_00104db6;
  }
  else {
LAB_00104db6:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x90,"t5 not correct");
  }
  if (((t6._M_string_length != 1) || (*t6._M_dataplus._M_p != 'a')) ||
     (t6._M_dataplus._M_p[1] != '\0')) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x93,"t6 not correct");
  }
  if (t7._M_string_length == 7) {
    iVar1 = strcmp(t7._M_dataplus._M_p,"this is");
    if (iVar1 == 0) goto LAB_00104e42;
  }
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
             ,0x96,"t7 not correct");
LAB_00104e42:
  if (((t8._M_string_length != 2) || (*t8._M_dataplus._M_p != 'i')) ||
     ((t8._M_dataplus._M_p[1] != 's' || (t8._M_dataplus._M_p[2] != '\0')))) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x99,"t8 not correct");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&t8);
  std::__cxx11::string::~string((string *)&t7);
  std::__cxx11::string::~string((string *)&t6);
  std::__cxx11::string::~string((string *)&t5);
  std::__cxx11::string::~string((string *)&t4);
  std::__cxx11::string::~string((string *)&t3);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  std::__cxx11::string::~string((string *)&t);
  return;
}

Assistant:

void Test1()
	{
		// test constructors and assignments, requiers that c_str, length and size, be working also.
		string t;
		string t1 = "this is t1";
		string t2 = t1;
		string t3( "this is t3 " );
		string t4( t3 );
		string t5( "this is t5    ", 12 );
		string t6;
		string t7;
		string t8;
		
		t6 = 'a';
		t7.assign( "this is t5    ", 7 );
		t8.assign( "this is t5    ", 5, 2 );
		
		if ( t.length() != 0 || t.size() != 0 )
			TestFailed( "default contrutor made non-zero sized string" );

		if ( t1.length() != 10 || strcmp( t1.c_str(), "this is t1" ) != 0 )
			TestFailed( "t1 not correct" );

		if ( t2.length() != 10 || strcmp( t2.c_str(), "this is t1" ) != 0 )
			TestFailed( "t2 not correct" );

		if ( t3.length() != 11 || strcmp( t3.c_str(), "this is t3 " ) != 0 )
			TestFailed( "t3 not correct" );

		if ( t4.length() != 11 || strcmp( t4.c_str(), "this is t3 " ) != 0 )
			TestFailed( "t4 not correct" );

		if ( t5.length() != 12 || strcmp( t5.c_str(), "this is t5  " ) != 0 )
			TestFailed( "t5 not correct" );

		if ( t6.length() != 1 || strcmp( t6.c_str(), "a" ) != 0 )
			TestFailed( "t6 not correct" );

		if ( t7.length() != 7 || strcmp( t7.c_str(), "this is" ) != 0 )
			TestFailed( "t7 not correct" );
		
		if ( t8.length() != 2 || strcmp( t8.c_str(), "is" ) != 0 )
			TestFailed( "t8 not correct" );

		TestPassed();
	}